

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O1

int32 feat_s2mfc2feat(feat_t *fcb,char *file,char *dir,char *cepext,int32 sf,int32 ef,mfcc_t ***feat
                     ,int32 maxfr)

{
  int iVar1;
  int32 iVar2;
  size_t sVar3;
  size_t sVar4;
  char *__s;
  ulong new_size;
  int iVar5;
  size_t n_elem;
  bool bVar6;
  long local_58;
  char *local_50;
  mfcc_t **mfc;
  
  if (fcb->cepsize < 1) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
            ,0x49c,"Bad cepsize: %d\n");
LAB_00126e7f:
    iVar2 = -1;
  }
  else {
    if (cepext == (char *)0x0) {
      cepext = "";
    }
    if (dir == (char *)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
              ,0x4b3,"At directory . (current directory)\n");
      local_58 = 1;
      dir = "";
      local_50 = "";
    }
    else {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
              ,0x4b6,"At directory %s\n",dir);
      sVar3 = strlen(dir);
      local_58 = sVar3 + 2;
      local_50 = "/";
    }
    sVar3 = strlen(file);
    sVar4 = strlen(cepext);
    if ((sVar4 < sVar3) && (iVar1 = strcmp(file + (sVar3 - sVar4),cepext), iVar1 == 0)) {
      cepext = "";
      sVar4 = 0;
    }
    n_elem = local_58 + sVar3 + sVar4;
    __s = (char *)__ckd_calloc__(n_elem,1,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                                 ,0x4cc);
    iVar1 = snprintf(__s,n_elem,"%s%s%s%s",dir,local_50,file,cepext);
    new_size = (ulong)iVar1;
    if (n_elem < new_size) {
      do {
        __s = (char *)__ckd_realloc__(__s,new_size,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                                      ,0x4d4);
        iVar1 = snprintf(__s,new_size,"%s%s%s%s",dir,local_50,file,cepext);
        bVar6 = new_size < (ulong)(long)iVar1;
        new_size = (long)iVar1;
      } while (bVar6);
    }
    iVar1 = fcb->window_size;
    iVar5 = 0;
    if (-1 < maxfr) {
      iVar5 = iVar1 * 2;
    }
    if (feat == (mfcc_t ***)0x0) {
      iVar2 = feat_s2mfc_read_norm_pad
                        (fcb,__s,iVar1,sf,ef,(mfcc_t ***)0x0,iVar5 + maxfr,fcb->cepsize);
      ckd_free(__s);
      if (iVar2 < 0) {
        return iVar2;
      }
    }
    else {
      iVar2 = feat_s2mfc_read_norm_pad(fcb,__s,iVar1,sf,ef,&mfc,iVar5 + maxfr,fcb->cepsize);
      ckd_free(__s);
      if (iVar2 < 0) {
        ckd_free_2d(mfc);
        goto LAB_00126e7f;
      }
      feat_compute_utt(fcb,mfc,iVar2,iVar1,feat);
      ckd_free_2d(mfc);
    }
    iVar2 = iVar2 + iVar1 * -2;
  }
  return iVar2;
}

Assistant:

int32
feat_s2mfc2feat(feat_t * fcb, const char *file, const char *dir, const char *cepext,
                int32 sf, int32 ef, mfcc_t *** feat, int32 maxfr)
{
    char *path;
    char *ps = "/";
    int32 win, nfr;
    size_t file_length, cepext_length, path_length = 0;
    mfcc_t **mfc;

    if (fcb->cepsize <= 0) {
        E_ERROR("Bad cepsize: %d\n", fcb->cepsize);
        return -1;
    }

    if (cepext == NULL)
        cepext = "";

    /*
     * Create mfc filename, combining file, dir and extension if
     * necessary
     */

    /*
     * First we decide about the path. If dir is defined, then use
     * it. Otherwise assume the filename already contains the path.
     */
    if (dir == NULL) {
        dir = "";
        ps = "";
        /*
         * This is not true but some 3rd party apps
         * may parse the output explicitly checking for this line
         */
        E_INFO("At directory . (current directory)\n");
    }
    else {
        E_INFO("At directory %s\n", dir);
        /*
         * Do not forget the path separator!
         */
        path_length += strlen(dir) + 1;
    }

    /*
     * Include cepext, if it's not already part of the filename.
     */
    file_length = strlen(file);
    cepext_length = strlen(cepext);
    if ((file_length > cepext_length)
        && (strcmp(file + file_length - cepext_length, cepext) == 0)) {
        cepext = "";
        cepext_length = 0;
    }

    /*
     * Do not forget the '\0'
     */
    path_length += file_length + cepext_length + 1;
    path = (char*) ckd_calloc(path_length, sizeof(char));

#ifdef HAVE_SNPRINTF
    /*
     * Paranoia is our best friend...
     */
    while ((file_length = snprintf(path, path_length, "%s%s%s%s", dir, ps, file, cepext)) > path_length) {
        path_length = file_length;
        path = (char*) ckd_realloc(path, path_length * sizeof(char));
    }
#else
    sprintf(path, "%s%s%s%s", dir, ps, file, cepext);
#endif

    win = feat_window_size(fcb);
    /* Pad maxfr with win, so we read enough raw feature data to
     * calculate the requisite number of dynamic features. */
    if (maxfr >= 0)
        maxfr += win * 2;

    if (feat != NULL) {
        /* Read mfc file including window or padding if necessary. */
        nfr = feat_s2mfc_read_norm_pad(fcb, path, win, sf, ef, &mfc, maxfr, fcb->cepsize);
        ckd_free(path);
        if (nfr < 0) {
            ckd_free_2d((void **) mfc);
            return -1;
        }

        /* Actually compute the features */
        feat_compute_utt(fcb, mfc, nfr, win, feat);
        
        ckd_free_2d((void **) mfc);
    }
    else {
        /* Just calculate the number of frames we would need. */
        nfr = feat_s2mfc_read_norm_pad(fcb, path, win, sf, ef, NULL, maxfr, fcb->cepsize);
        ckd_free(path);
        if (nfr < 0)
            return nfr;
    }


    return (nfr - win * 2);
}